

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cab.c
# Opt level: O0

void verify2(archive *a,archive_entry *ae)

{
  archive_entry *in_RSI;
  char *in_RDI;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  void *in_stack_00000010;
  wchar_t in_stack_00000028;
  archive_entry *paVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  uint in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  
  archive_entry_filetype(in_RSI);
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1b7f1b,in_stack_00000010);
  archive_entry_mode(in_RSI);
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1b7f5d,in_stack_00000010);
  archive_entry_uid(in_RSI);
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1b7f99,in_stack_00000010);
  archive_entry_gid(in_RSI);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1b7fd5,in_stack_00000010);
  archive_entry_uname(paVar1);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,in_RDI,(char *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_gname(paVar1);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,in_RDI,(char *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_pathname(paVar1);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,in_RDI,(char *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_symlink(paVar1);
  paVar1 = (archive_entry *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,in_RDI,(char *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_hardlink(paVar1);
  assertion_assert((char *)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),paVar1);
  return;
}

Assistant:

static void
verify2(const char *refname, enum comp_type comp)
{
	struct archive_entry *ae;
	struct archive *a;
	char buff[128];
	char zero[128];

	if (comp == MSZIP && !libz_enabled) {
		skipping("Skipping CAB format(MSZIP) check for %s",
		  refname);
		return;
	}
	memset(zero, 0, sizeof(zero));
	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular empty. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	if (comp != STORE) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	}
	/* Verify regular file1. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify regular file2. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0666), archive_entry_mode(ae));
	assertEqualString("dir2/file2", archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_uid(ae));
	assertEqualInt(0, archive_entry_gid(ae));
	assertEqualInt(file2_size, archive_entry_size(ae));
	assertEqualInt(file2_size, archive_read_data(a, buff, file2_size));
	assertEqualMem(buff, file2, file2_size);

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	if (comp != STORE) {
		assertEqualInt(4, archive_file_count(a));
	} else {
		assertEqualInt(3, archive_file_count(a));
	}

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_CAB, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}